

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

config_value * config_value_create_array(size_t length)

{
  config_array *pcVar1;
  config_value *value;
  size_t length_local;
  
  length_local = (size_t)malloc(0x10);
  if ((undefined4 *)length_local == (undefined4 *)0x0) {
    length_local = 0;
  }
  else {
    *(undefined4 *)length_local = 0;
    pcVar1 = config_array_create(length);
    *(config_array **)(length_local + 8) = pcVar1;
    if (*(long *)(length_local + 8) == 0) {
      free((void *)length_local);
      length_local = 0;
    }
  }
  return (config_value *)length_local;
}

Assistant:

struct config_value *config_value_create_array(size_t length)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = ARRAY;

        value->data.array = config_array_create(length);

        if (value->data.array == NULL) {
                free(value);

                return NULL;
        }

        return value;
}